

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.h
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeCube>::TPZCompElH1(TPZCompElH1<pzshape::TPZShapeCube> *this)

{
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0178f230;
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeCube>,&PTR_PTR_017879a8);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_017875d8;
  local_20 = -1;
  TPZManVector<long,_27>::TPZManVector(&this->fConnectIndexes,0x1b,&local_20);
  this->fh1fam = EH1Standard;
  return;
}

Assistant:

TPZCompElH1() = default;